

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_ssize nghttp2_session_mem_send2(nghttp2_session *session,uint8_t **data_ptr)

{
  int lib_error_code;
  int iVar1;
  undefined8 *in_RSI;
  long in_RDI;
  nghttp2_ssize len;
  int rv;
  nghttp2_session *in_stack_00000038;
  int in_stack_0000006c;
  uint8_t **in_stack_00000070;
  nghttp2_session *in_stack_00000078;
  nghttp2_ssize local_8;
  
  *in_RSI = 0;
  local_8 = nghttp2_session_mem_send_internal(in_stack_00000078,in_stack_00000070,in_stack_0000006c)
  ;
  if (((0 < local_8) && (*(long *)(in_RDI + 0x288) != 0)) &&
     (lib_error_code = session_after_frame_sent1(in_stack_00000038), lib_error_code < 0)) {
    iVar1 = nghttp2_is_fatal(lib_error_code);
    if (iVar1 == 0) {
      __assert_fail("nghttp2_is_fatal(rv)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                    ,0xde4,
                    "nghttp2_ssize nghttp2_session_mem_send2(nghttp2_session *, const uint8_t **)");
    }
    local_8 = (nghttp2_ssize)lib_error_code;
  }
  return local_8;
}

Assistant:

nghttp2_ssize nghttp2_session_mem_send2(nghttp2_session *session,
                                        const uint8_t **data_ptr) {
  int rv;
  nghttp2_ssize len;

  *data_ptr = NULL;

  len = nghttp2_session_mem_send_internal(session, data_ptr, 1);
  if (len <= 0) {
    return len;
  }

  if (session->aob.item) {
    /* We have to call session_after_frame_sent1 here to handle stream
       closure upon transmission of frames.  Otherwise, END_STREAM may
       be reached to client before we call nghttp2_session_mem_send
       again and we may get exceeding number of incoming streams. */
    rv = session_after_frame_sent1(session);
    if (rv < 0) {
      assert(nghttp2_is_fatal(rv));
      return (nghttp2_ssize)rv;
    }
  }

  return len;
}